

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                  *this)

{
  QString::~QString((QString *)0x2998e0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)0x2998ea);
  return;
}

Assistant:

~QStringBuilder() = default;